

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  Vdbe *p;
  Table *pTVar1;
  int iVar2;
  SrcItem *pSVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char *z;
  Table *pTab;
  StrAccum str;
  WhereLoop *pLoop;
  int i;
  char *zMsg;
  sqlite3 *db;
  Vdbe *v;
  SrcItem *pItem;
  int ret;
  WhereLevel *pLevel_local;
  WhereInfo *pWInfo_local;
  Parse *pParse_local;
  char zBuf [100];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = pWInfo->pTabList->a + pLevel->iFrom;
  p = pParse->pVdbe;
  sqlite3StrAccumInit((StrAccum *)&pTab,pParse->db,(char *)&pParse_local,100,1000000000);
  str.mxAlloc._1_1_ = 1;
  sqlite3_str_appendf((StrAccum *)&pTab,"BLOOM FILTER ON %S (",pSVar3);
  str._24_8_ = pLevel->pWLoop;
  if ((((WhereLoop *)str._24_8_)->wsFlags & 0x100) == 0) {
    for (pLoop._4_4_ = (uint)((WhereLoop *)str._24_8_)->nSkip;
        (int)pLoop._4_4_ < (int)(uint)*(ushort *)(str._24_8_ + 0x18); pLoop._4_4_ = pLoop._4_4_ + 1)
    {
      pcVar4 = explainIndexColumnName(*(Index **)(str._24_8_ + 0x20),pLoop._4_4_);
      if ((int)(uint)*(ushort *)(str._24_8_ + 0x36) < (int)pLoop._4_4_) {
        sqlite3_str_append((sqlite3_str *)&pTab," AND ",5);
      }
      sqlite3_str_appendf((StrAccum *)&pTab,"%s=?",pcVar4);
    }
  }
  else {
    pTVar1 = pSVar3->pTab;
    if (pTVar1->iPKey < 0) {
      sqlite3_str_appendf((StrAccum *)&pTab,"rowid=?");
    }
    else {
      sqlite3_str_appendf((StrAccum *)&pTab,"%s=?",pTVar1->aCol[pTVar1->iPKey].zCnName);
    }
  }
  sqlite3_str_append((sqlite3_str *)&pTab,")",1);
  pcVar4 = sqlite3StrAccumFinish((sqlite3_str *)&pTab);
  iVar2 = sqlite3VdbeCurrentAddr(p);
  iVar2 = sqlite3VdbeAddOp4(p,0xb9,iVar2,pParse->addrExplain,0,pcVar4,-6);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}